

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O2

TextMeasures * __thiscall
PDFUsedFont::CalculateTextDimensions
          (TextMeasures *__return_storage_ptr__,PDFUsedFont *this,string *inText,long inFontSize)

{
  ULongList *inUnicodeCharacters;
  UnicodeString unicode;
  UIntList glyphs;
  UnicodeString local_50;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node.super__List_node_base._M_prev =
       local_38._M_impl._M_node.super__List_node_base._M_next;
  UnicodeString::UnicodeString(&local_50);
  UnicodeString::FromUTF8(&local_50,inText);
  inUnicodeCharacters = UnicodeString::GetUnicodeList_abi_cxx11_(&local_50);
  FreeTypeFaceWrapper::GetGlyphsForUnicodeText
            (&this->mFaceWrapper,inUnicodeCharacters,(UIntList *)&local_38);
  CalculateTextDimensions(__return_storage_ptr__,this,(UIntList *)&local_38,inFontSize);
  UnicodeString::~UnicodeString(&local_50);
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_38);
  return __return_storage_ptr__;
}

Assistant:

PDFUsedFont::TextMeasures PDFUsedFont::CalculateTextDimensions(const std::string& inText,long inFontSize)
{
	UIntList glyphs;
    UnicodeString unicode;
        
    unicode.FromUTF8(inText);
	mFaceWrapper.GetGlyphsForUnicodeText(unicode.GetUnicodeList(),glyphs);
	return CalculateTextDimensions(glyphs,inFontSize);
}